

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O0

TracepointMap * __thiscall
HawkTracer::client::TracepointMap::category_to_string_abi_cxx11_
          (TracepointMap *this,Category category)

{
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  Category local_14;
  TracepointMap *pTStack_10;
  Category category_local;
  
  local_14 = category;
  pTStack_10 = this;
  if (category == Lua) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"lua",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (category == Native) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"native",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"default",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  return this;
}

Assistant:

std::string TracepointMap::category_to_string(Category category)
{
    switch (category)
    {
    case Lua:
        return "lua";
    case Native:
        return "native";
    default:
        return "default";
    }
}